

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

drmp3_bool32
drmp3_find_closest_seek_point(drmp3 *pMP3,drmp3_uint64 frameIndex,drmp3_uint32 *pSeekPointIndex)

{
  drmp3_uint32 iSeekPoint;
  drmp3_uint32 *pSeekPointIndex_local;
  drmp3_uint64 frameIndex_local;
  drmp3 *pMP3_local;
  drmp3_bool32 local_4;
  
  *pSeekPointIndex = 0;
  if (frameIndex < pMP3->pSeekPoints->pcmFrameIndex) {
    local_4 = 0;
  }
  else {
    iSeekPoint = 0;
    while ((iSeekPoint < pMP3->seekPointCount &&
           (pMP3->pSeekPoints[iSeekPoint].pcmFrameIndex <= frameIndex))) {
      *pSeekPointIndex = iSeekPoint;
      iSeekPoint = iSeekPoint + 1;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

drmp3_bool32 drmp3_find_closest_seek_point(drmp3* pMP3, drmp3_uint64 frameIndex, drmp3_uint32* pSeekPointIndex)
{
            drmp3_assert(pSeekPointIndex != NULL);

    *pSeekPointIndex = 0;

    if (frameIndex < pMP3->pSeekPoints[0].pcmFrameIndex) {
        return DRMP3_FALSE;
    }

    // Linear search for simplicity to begin with while I'm getting this thing working. Once it's all working change this to a binary search.
    for (drmp3_uint32 iSeekPoint = 0; iSeekPoint < pMP3->seekPointCount; ++iSeekPoint) {
        if (pMP3->pSeekPoints[iSeekPoint].pcmFrameIndex > frameIndex) {
            break;  // Found it.
        }

        *pSeekPointIndex = iSeekPoint;
    }

    return DRMP3_TRUE;
}